

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NVT.cpp
# Opt level: O3

void __thiscall OpenMD::NVT::NVT(NVT *this,SimInfo *info)

{
  SimInfo *pSVar1;
  Globals *pGVar2;
  pair<double,_double> local_28;
  
  VelocityVerletIntegrator::VelocityVerletIntegrator(&this->super_VelocityVerletIntegrator,info);
  (this->super_VelocityVerletIntegrator).super_Integrator._vptr_Integrator =
       (_func_int **)&PTR__NVT_002f9048;
  this->maxIterNum_ = 4;
  this->chiTolerance_ = 1e-06;
  (this->oldVel_).
  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->oldVel_).
  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->oldVel_).
  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->oldJi_).
  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->oldJi_).
  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->oldJi_).
  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pSVar1 = (this->super_VelocityVerletIntegrator).super_Integrator.info_;
  pGVar2 = pSVar1->simParams_;
  if ((pGVar2->UseIntialExtendedSystemState).super_ParameterBase.field_0x2b == '\0') {
    local_28.first = 0.0;
    local_28.second = 0.0;
    Snapshot::setThermostat(pSVar1->sman_->currentSnapshot_,&local_28);
  }
  if ((pGVar2->TargetTemp).super_ParameterBase.empty_ == true) {
    builtin_strncpy(painCave.errMsg + 0x30,"tTemp_!\n",9);
    builtin_strncpy(painCave.errMsg + 0x20," without a targe",0x10);
    builtin_strncpy(painCave.errMsg + 0x10,"e NVT integrator",0x10);
    builtin_strncpy(painCave.errMsg,"You can\'t use th",0x10);
    painCave.isFatal = 1;
    painCave.severity = 1;
    simError();
  }
  else {
    this->targetTemp_ = (pGVar2->TargetTemp).data_;
  }
  if ((pGVar2->TauThermostat).super_ParameterBase.empty_ == true) {
    memcpy(&painCave,
           "If you use the constant temperature\n\tintegrator, you must set tauThermostat.\n",0x4e);
    painCave.isFatal = 1;
    painCave.severity = 1;
    simError();
  }
  else {
    this->tauThermostat_ = (pGVar2->TauThermostat).data_;
  }
  Integrator::updateSizes((Integrator *)this);
  return;
}

Assistant:

NVT::NVT(SimInfo* info) :
      VelocityVerletIntegrator(info), maxIterNum_(4), chiTolerance_(1e-6) {
    Globals* simParams = info_->getSimParams();

    if (!simParams->getUseIntialExtendedSystemState()) {
      Snapshot* snap = info_->getSnapshotManager()->getCurrentSnapshot();
      snap->setThermostat(make_pair(0.0, 0.0));
    }

    if (!simParams->haveTargetTemp()) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "You can't use the NVT integrator without a targetTemp_!\n");
      painCave.isFatal  = 1;
      painCave.severity = OPENMD_ERROR;
      simError();
    } else {
      targetTemp_ = simParams->getTargetTemp();
    }

    // We must set tauThermostat.

    if (!simParams->haveTauThermostat()) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "If you use the constant temperature\n"
               "\tintegrator, you must set tauThermostat.\n");

      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    } else {
      tauThermostat_ = simParams->getTauThermostat();
    }

    updateSizes();
  }